

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void modified_signaturecase::test_method<picnic_params_t_const&>(anon_enum_32 *parameters)

{
  undefined1 auVar1 [64];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *pbVar3;
  undefined1 auVar4 [64];
  modified_signaturecase t;
  context_frame context_frame_1580;
  anon_enum_32 *in_stack_00000e18;
  modified_signaturecase *in_stack_00000e20;
  lazy_ostream *in_stack_fffffffffffff588;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff590;
  std_string *in_stack_fffffffffffff598;
  basic_cstring<const_char> *in_stack_fffffffffffff5a0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff5b0;
  const_string *in_stack_fffffffffffff5c8;
  size_t in_stack_fffffffffffff5d0;
  const_string *in_stack_fffffffffffff5d8;
  basic_wrap_stringstream<char> *file;
  unit_test_log_t *in_stack_fffffffffffff5e0;
  undefined1 local_988 [64];
  undefined1 local_948 [64];
  undefined1 local_908 [64];
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 auStack_848 [24];
  undefined1 local_830 [40];
  undefined1 auStack_808 [24];
  basic_cstring<const_char> local_7e0;
  undefined1 local_7c9;
  undefined1 local_7c8 [64];
  undefined1 local_788 [64];
  undefined1 local_748 [64];
  undefined1 local_708 [64];
  undefined1 local_6c8 [64];
  undefined1 auStack_688 [24];
  undefined1 local_670 [40];
  undefined1 auStack_648 [24];
  basic_cstring<const_char> local_620;
  undefined1 local_609;
  undefined1 local_608 [64];
  undefined1 local_5c8 [64];
  undefined1 local_588 [64];
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 auStack_4c8 [24];
  undefined1 local_4b0 [40];
  undefined1 auStack_488 [24];
  basic_cstring<const_char> local_460;
  undefined1 local_449;
  undefined1 local_448 [64];
  undefined1 local_408 [64];
  undefined1 local_3c8 [64];
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 auStack_308 [24];
  undefined1 local_2f0 [40];
  undefined1 auStack_2c8 [24];
  basic_cstring<const_char> local_2a0;
  undefined1 local_289;
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [64];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 auStack_148 [24];
  undefined1 local_130 [40];
  undefined1 auStack_108 [24];
  basic_cstring<const_char> local_d8;
  anon_enum_32 *local_c8;
  context_frame local_c [3];
  
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff598,(char (*) [1])in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
             in_stack_fffffffffffff598,(char (*) [11])in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)in_stack_fffffffffffff598,(char (*) [4])in_stack_fffffffffffff590);
  local_c8 = (anon_enum_32 *)
             boost::test_tools::tt_detail::print_helper<picnic_params_t>
                       ((anon_enum_32 *)in_stack_fffffffffffff588);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)in_stack_fffffffffffff598,
             (print_helper_t<picnic_params_t> *)in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)in_stack_fffffffffffff598,(char (*) [3])in_stack_fffffffffffff590);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
              *)0x1cf297);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)0x1cf2a4);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)0x1cf2b1);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)0x1cf2be);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                      *)0x1cf2cb);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(local_c);
  if (bVar2) {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_108 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_148 = auVar1._0_24_;
    local_130 = auVar1._24_40_;
    local_188 = vmovdqu64_avx512f(auVar4);
    local_1c8 = vmovdqu64_avx512f(auVar4);
    local_208 = vmovdqu64_avx512f(auVar4);
    local_248 = vmovdqu64_avx512f(auVar4);
    local_288 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_288);
    local_289 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [15])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_2c8 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_308 = auVar1._0_24_;
    local_2f0 = auVar1._24_40_;
    local_348 = vmovdqu64_avx512f(auVar4);
    local_388 = vmovdqu64_avx512f(auVar4);
    local_3c8 = vmovdqu64_avx512f(auVar4);
    local_408 = vmovdqu64_avx512f(auVar4);
    local_448 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_448);
    local_449 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [16])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::setup_conditional<modified_signaturecase>
              ((modified_signaturecase *)in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_488 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_4c8 = auVar1._0_24_;
    local_4b0 = auVar1._24_40_;
    local_508 = vmovdqu64_avx512f(auVar4);
    local_548 = vmovdqu64_avx512f(auVar4);
    local_588 = vmovdqu64_avx512f(auVar4);
    local_5c8 = vmovdqu64_avx512f(auVar4);
    local_608 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_608);
    local_609 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [13])in_stack_fffffffffffff588);
    this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    _impl<picnic_params_t>(in_stack_00000e20,in_stack_00000e18);
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_648 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_688 = auVar1._0_24_;
    local_670 = auVar1._24_40_;
    local_6c8 = vmovdqu64_avx512f(auVar4);
    local_708 = vmovdqu64_avx512f(auVar4);
    local_748 = vmovdqu64_avx512f(auVar4);
    local_788 = vmovdqu64_avx512f(auVar4);
    local_7c8 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_7c8);
    local_7c9 = 0x22;
    line_num = boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    msg = boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::teardown_conditional<modified_signaturecase>
              ((modified_signaturecase *)in_stack_fffffffffffff590);
    pbVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_808 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar4);
    auStack_848 = auVar1._0_24_;
    local_830 = auVar1._24_40_;
    local_888 = vmovdqu64_avx512f(auVar4);
    local_8c8 = vmovdqu64_avx512f(auVar4);
    local_908 = vmovdqu64_avx512f(auVar4);
    local_948 = vmovdqu64_avx512f(auVar4);
    local_988 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_988);
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    this_00 = boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    s = boost::operator<<(in_stack_fffffffffffff590,(char (*) [15])in_stack_fffffffffffff588);
    pbVar3 = (basic_wrap_stringstream<char> *)
             boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)this_00,(std_string *)s);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar3);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1cfb11);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_signature, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    size_t signature_len = max_signature_size;
    BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
    signature.resize(signature_len);
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size()));

    std::uniform_int_distribution<unsigned int> dist_diff{1, 255};
    std::uniform_int_distribution<unsigned int> dist_pos{1, PICNIC_MAX_SIGNATURE_SIZE};
    std::random_device rnd;
    std::default_random_engine eng{rnd()};

    for (size_t l = dist_pos(eng), rounds = rep; rounds; l += dist_pos(eng), --rounds) {
      std::vector<uint8_t> signature2{signature};
      signature2[l % signature2.size()] += dist_diff(eng);

      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size()));
    }
  }
}